

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O0

Aig_Man_t * Aig_ManSclPart(Aig_Man_t *pAig,int fLatchConst,int fLatchEqual,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *p;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Vec_Int_t *Entry;
  Aig_Man_t *p_00;
  Aig_Man_t *pAVar9;
  int nClasses;
  Aig_Man_t *pNew;
  Aig_Man_t *pTemp;
  int *pMapBack;
  uint local_38;
  int nCountRegs;
  int nCountPis;
  int i;
  Vec_Int_t *vPart;
  Vec_Ptr_t *vResult;
  int local_18;
  int fVerbose_local;
  int fLatchEqual_local;
  int fLatchConst_local;
  Aig_Man_t *pAig_local;
  
  vResult._4_4_ = fVerbose;
  local_18 = fLatchEqual;
  fVerbose_local = fLatchConst;
  _fLatchEqual_local = pAig;
  if (pAig->vClockDoms == (Vec_Vec_t *)0x0) {
    vPart = (Vec_Int_t *)Aig_ManRegPartitionSimple(pAig,0,0);
  }
  else {
    vPart = (Vec_Int_t *)Vec_PtrAlloc(100);
    for (nCountRegs = 0; iVar4 = nCountRegs,
        iVar3 = Vec_PtrSize((Vec_Ptr_t *)_fLatchEqual_local->vClockDoms), iVar4 < iVar3;
        nCountRegs = nCountRegs + 1) {
      _nCountPis = (Vec_Int_t *)Vec_PtrEntry((Vec_Ptr_t *)_fLatchEqual_local->vClockDoms,nCountRegs)
      ;
      p = vPart;
      Entry = Vec_IntDup(_nCountPis);
      Vec_PtrPush((Vec_Ptr_t *)p,Entry);
    }
  }
  pAVar9 = _fLatchEqual_local;
  iVar4 = Aig_ManObjNumMax(_fLatchEqual_local);
  Aig_ManReprStart(pAVar9,iVar4);
  for (nCountRegs = 0; iVar4 = nCountRegs, iVar3 = Vec_PtrSize((Vec_Ptr_t *)vPart), iVar4 < iVar3;
      nCountRegs = nCountRegs + 1) {
    _nCountPis = (Vec_Int_t *)Vec_PtrEntry((Vec_Ptr_t *)vPart,nCountRegs);
    pAVar9 = Aig_ManRegCreatePart
                       (_fLatchEqual_local,_nCountPis,(int *)&local_38,(int *)((long)&pMapBack + 4),
                        (int **)&pTemp);
    Aig_ManSetRegNum(pAVar9,pAVar9->nRegs);
    if (0 < (int)local_38) {
      p_00 = Aig_ManScl(pAVar9,fVerbose_local,local_18,0,-1,-1,vResult._4_4_,0);
      iVar3 = Aig_TransferMappedClasses(_fLatchEqual_local,pAVar9,(int *)pTemp);
      iVar4 = nCountRegs;
      if (vResult._4_4_ != 0) {
        uVar5 = Vec_IntSize(_nCountPis);
        iVar6 = Aig_ManCiNum(pAVar9);
        iVar7 = Vec_IntSize(_nCountPis);
        uVar2 = local_38;
        uVar1 = pMapBack._4_4_;
        iVar8 = Aig_ManNodeNum(pAVar9);
        printf("%3d : Reg = %4d. PI = %4d. (True = %4d. Regs = %4d.) And = %5d. It = %3d. Cl = %5d\n"
               ,(ulong)(uint)iVar4,(ulong)uVar5,(ulong)(uint)(iVar6 - iVar7),(ulong)uVar2,
               (ulong)uVar1,iVar8,0,iVar3);
      }
      Aig_ManStop(p_00);
    }
    Aig_ManStop(pAVar9);
    if (pTemp != (Aig_Man_t *)0x0) {
      free(pTemp);
      pTemp = (Aig_Man_t *)0x0;
    }
  }
  pAVar9 = Aig_ManDupRepr(_fLatchEqual_local,0);
  Aig_ManSeqCleanup(pAVar9);
  Vec_VecFree((Vec_Vec_t *)vPart);
  return pAVar9;
}

Assistant:

Aig_Man_t * Aig_ManSclPart( Aig_Man_t * pAig, int fLatchConst, int fLatchEqual, int fVerbose ) 
{
    Vec_Ptr_t * vResult;
    Vec_Int_t * vPart;
    int i, nCountPis, nCountRegs;
    int * pMapBack;
    Aig_Man_t * pTemp, * pNew;
    int nClasses;

    if ( pAig->vClockDoms ) 
    {
        vResult = Vec_PtrAlloc( 100 );
        Vec_PtrForEachEntry( Vec_Int_t *, (Vec_Ptr_t *)pAig->vClockDoms, vPart, i )
            Vec_PtrPush( vResult, Vec_IntDup(vPart) );
    } 
    else
        vResult = Aig_ManRegPartitionSimple( pAig, 0, 0 );

    Aig_ManReprStart( pAig, Aig_ManObjNumMax(pAig) );
    Vec_PtrForEachEntry( Vec_Int_t *, vResult, vPart, i ) 
    {
        pTemp = Aig_ManRegCreatePart( pAig, vPart, &nCountPis, &nCountRegs, &pMapBack );
        Aig_ManSetRegNum( pTemp, pTemp->nRegs );
        if (nCountPis>0) 
        {
            pNew = Aig_ManScl( pTemp, fLatchConst, fLatchEqual, 0, -1, -1, fVerbose, 0 );
            nClasses = Aig_TransferMappedClasses( pAig, pTemp, pMapBack );
            if ( fVerbose )
                printf( "%3d : Reg = %4d. PI = %4d. (True = %4d. Regs = %4d.) And = %5d. It = %3d. Cl = %5d\n",
                        i, Vec_IntSize(vPart), Aig_ManCiNum(pTemp)-Vec_IntSize(vPart), nCountPis, nCountRegs, Aig_ManNodeNum(pTemp), 0, nClasses );
            Aig_ManStop( pNew );
        }
        Aig_ManStop( pTemp );
        ABC_FREE( pMapBack );
    }
    pNew = Aig_ManDupRepr( pAig, 0 );
    Aig_ManSeqCleanup( pNew );
    Vec_VecFree( (Vec_Vec_t*)vResult );
    return pNew;
}